

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointerAnalysisFSInv.h
# Opt level: O0

bool __thiscall dg::pta::PointerAnalysisFSInv::beforeProcessed(PointerAnalysisFSInv *this,PSNode *n)

{
  bool bVar1;
  map<dg::pta::PSNode_*,_std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>,_std::less<dg::pta::PSNode_*>,_std::allocator<std::pair<dg::pta::PSNode_*const,_std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>_>_>_>
  *pmVar2;
  PointerSubgraph *this_00;
  PSNode *pPVar3;
  PSNode *in_RSI;
  PointerAnalysisFS *in_RDI;
  PSNode *pred;
  MemoryMapT *mm;
  PSNode *in_stack_ffffffffffffffc0;
  GlobalNodesT *in_stack_ffffffffffffffd8;
  bool local_1;
  
  pmVar2 = SubgraphNode<dg::pta::PSNode>::
           getData<std::map<dg::pta::PSNode*,std::unique_ptr<dg::pta::MemoryObject,std::default_delete<dg::pta::MemoryObject>>,std::less<dg::pta::PSNode*>,std::allocator<std::pair<dg::pta::PSNode*const,std::unique_ptr<dg::pta::MemoryObject,std::default_delete<dg::pta::MemoryObject>>>>>>
                     ((SubgraphNode<dg::pta::PSNode> *)(in_RSI + 8));
  if (pmVar2 == (map<dg::pta::PSNode_*,_std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>,_std::less<dg::pta::PSNode_*>,_std::allocator<std::pair<dg::pta::PSNode_*const,_std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>_>_>_>
                 *)0x0) {
    bVar1 = needsMerge(in_stack_ffffffffffffffc0);
    if (bVar1) {
      pmVar2 = PointerAnalysisFS::createMM(in_RDI);
      this_00 = PointerGraph::getEntry((in_RDI->super_PointerAnalysis).PG);
      pPVar3 = PointerSubgraph::getRoot(this_00);
      if (in_RSI == pPVar3) {
        PointerGraph::getGlobals((in_RDI->super_PointerAnalysis).PG);
        PointerAnalysisFS::mergeGlobalsState(pmVar2,in_stack_ffffffffffffffd8);
      }
    }
    else {
      pPVar3 = SubgraphNode<dg::pta::PSNode>::getSinglePredecessor
                         ((SubgraphNode<dg::pta::PSNode> *)0x16b181);
      pmVar2 = SubgraphNode<dg::pta::PSNode>::
               getData<std::map<dg::pta::PSNode*,std::unique_ptr<dg::pta::MemoryObject,std::default_delete<dg::pta::MemoryObject>>,std::less<dg::pta::PSNode*>,std::allocator<std::pair<dg::pta::PSNode*const,std::unique_ptr<dg::pta::MemoryObject,std::default_delete<dg::pta::MemoryObject>>>>>>
                         ((SubgraphNode<dg::pta::PSNode> *)(pPVar3 + 8));
    }
    SubgraphNode<dg::pta::PSNode>::
    setData<std::map<dg::pta::PSNode*,std::unique_ptr<dg::pta::MemoryObject,std::default_delete<dg::pta::MemoryObject>>,std::less<dg::pta::PSNode*>,std::allocator<std::pair<dg::pta::PSNode*const,std::unique_ptr<dg::pta::MemoryObject,std::default_delete<dg::pta::MemoryObject>>>>>>
              ((SubgraphNode<dg::pta::PSNode> *)(in_RSI + 8),pmVar2);
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool beforeProcessed(PSNode *n) override {
        MemoryMapT *mm = n->getData<MemoryMapT>();
        if (mm)
            return false;

        // on these nodes the memory map can change
        if (needsMerge(n)) { // root node
            mm = createMM();

            // if this is the root of the entry procedure,
            // we must propagate the points-to information
            // from the globals initialization
            if (n == PG->getEntry()->getRoot()) {
                mergeGlobalsState(mm, PG->getGlobals());
            }
        } else {
            // this node can not change the memory map,
            // so just add a pointer from the predecessor
            // to this map
            PSNode *pred = n->getSinglePredecessor();
            mm = pred->getData<MemoryMapT>();
            assert(mm && "No memory map in the predecessor");
        }

        assert(mm && "Did not create the MM");

        // memory map initialized, set it as data,
        // so that we won't initialize it again
        n->setData<MemoryMapT>(mm);

        return true;
    }